

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O2

void llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode
               (FileInfo *value,BinaryDecoder *coder)

{
  uint64_t uVar1;
  
  uVar1 = BinaryDecoder::read64(coder);
  value->device = uVar1;
  uVar1 = BinaryDecoder::read64(coder);
  value->inode = uVar1;
  uVar1 = BinaryDecoder::read64(coder);
  value->mode = uVar1;
  uVar1 = BinaryDecoder::read64(coder);
  value->size = uVar1;
  BinaryCodingTraits<llbuild::basic::FileTimestamp>::decode(&value->modTime,coder);
  BinaryCodingTraits<llbuild::basic::FileChecksum>::decode(&value->checksum,coder);
  return;
}

Assistant:

static inline void decode(FileInfo& value, BinaryDecoder& coder) {
    coder.read(value.device);
    coder.read(value.inode);
    coder.read(value.mode);
    coder.read(value.size);
    coder.read(value.modTime);
    coder.read(value.checksum);
  }